

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O0

Ivy_Supp_t * Ivy_ObjSuppStart(Ivy_Man_t *pAig,Ivy_Obj_t *pObj)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  Ivy_Supp_t *pIVar4;
  Ivy_Supp_t *pSupp;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *pAig_local;
  
  pIVar4 = Ivy_ObjSupp(pAig,pObj);
  pIVar4->fMark = '\0';
  pIVar4->Delay = 0;
  pIVar4->nSize = '\x01';
  uVar1 = *(undefined1 *)((long)&pObj->Id + 1);
  uVar2 = *(undefined1 *)((long)&pObj->Id + 2);
  uVar3 = *(undefined1 *)((long)&pObj->Id + 3);
  pIVar4[1].nSize = *(undefined1 *)&pObj->Id;
  pIVar4[1].fMark = uVar1;
  pIVar4[1].fMark2 = uVar2;
  pIVar4[1].fMark3 = uVar3;
  return pIVar4;
}

Assistant:

static inline Ivy_Supp_t * Ivy_ObjSuppStart( Ivy_Man_t * pAig, Ivy_Obj_t * pObj ) 
{ 
    Ivy_Supp_t * pSupp;
    pSupp = Ivy_ObjSupp( pAig, pObj );
    pSupp->fMark = 0;
    pSupp->Delay = 0;
    pSupp->nSize = 1;
    pSupp->pArray[0] = pObj->Id;
    return pSupp;
}